

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O0

int tcmalloc::AlignmentForSize(size_t size)

{
  LogItem b;
  LogItem b_00;
  LogItem c;
  LogItem c_00;
  LogItem d;
  LogItem d_00;
  int iVar1;
  LogItem a;
  LogItem a_00;
  LogItem local_98;
  LogItem local_88;
  LogItem local_78;
  LogItem local_68;
  LogItem local_58;
  LogItem local_48;
  LogItem local_38;
  LogItem local_28;
  uint local_14;
  size_t sStack_10;
  int alignment;
  size_t size_local;
  
  local_14 = 8;
  sStack_10 = size;
  if (size < 0x40001) {
    if (size < 0x80) {
      if (0xf < size) {
        local_14 = 0x10;
      }
    }
    else {
      iVar1 = LgFloor(size);
      local_14 = (1 << ((byte)iVar1 & 0x1f)) / 8;
    }
  }
  else {
    local_14 = 0x2000;
  }
  if (0x2000 < local_14) {
    local_14 = 0x2000;
  }
  if ((0xf < sStack_10) && (local_14 < 0x10)) {
    LogItem::LogItem(&local_28,"size < kMinAlign || alignment >= kMinAlign");
    LogItem::LogItem(&local_38);
    LogItem::LogItem(&local_48);
    LogItem::LogItem(&local_58);
    a._4_4_ = 0;
    a.tag_ = local_28.tag_;
    b.u_.str = local_38.u_.str;
    b.tag_ = local_38.tag_;
    b._4_4_ = local_38._4_4_;
    c.u_.str = local_48.u_.str;
    c.tag_ = local_48.tag_;
    c._4_4_ = local_48._4_4_;
    d.u_.str = local_58.u_.str;
    d.tag_ = local_58.tag_;
    d._4_4_ = local_58._4_4_;
    a.u_.str = local_28.u_.str;
    Log(kCrash,
        "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/common.cc",0x66
        ,a,b,c,d);
    do {
    } while( true );
  }
  if ((local_14 & local_14 - 1) == 0) {
    return local_14;
  }
  LogItem::LogItem(&local_68,"(alignment & (alignment - 1)) == 0");
  LogItem::LogItem(&local_78);
  LogItem::LogItem(&local_88);
  LogItem::LogItem(&local_98);
  a_00._4_4_ = 0;
  a_00.tag_ = local_68.tag_;
  b_00.u_.str = local_78.u_.str;
  b_00.tag_ = local_78.tag_;
  b_00._4_4_ = local_78._4_4_;
  c_00.u_.str = local_88.u_.str;
  c_00.tag_ = local_88.tag_;
  c_00._4_4_ = local_88._4_4_;
  d_00.u_.str = local_98.u_.str;
  d_00.tag_ = local_98.tag_;
  d_00._4_4_ = local_98._4_4_;
  a_00.u_.str = local_68.u_.str;
  Log(kCrash,"/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/common.cc"
      ,0x67,a_00,b_00,c_00,d_00);
  do {
  } while( true );
}

Assistant:

static int AlignmentForSize(size_t size) {
  int alignment = kAlignment;
  if (size > kMaxSize) {
    // Cap alignment at kPageSize for large sizes.
    alignment = kPageSize;
  } else if (size >= 128) {
    // Space wasted due to alignment is at most 1/8, i.e., 12.5%.
    alignment = (1 << LgFloor(size)) / 8;
  } else if (size >= kMinAlign) {
    // We need an alignment of at least 16 bytes to satisfy
    // requirements for some SSE types.
    alignment = kMinAlign;
  }
  // Maximum alignment allowed is page size alignment.
  if (alignment > kPageSize) {
    alignment = kPageSize;
  }
  CHECK_CONDITION(size < kMinAlign || alignment >= kMinAlign);
  CHECK_CONDITION((alignment & (alignment - 1)) == 0);
  return alignment;
}